

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

QPlatformMenu * __thiscall
QMenuBarPrivate::findInsertionPlatformMenu(QMenuBarPrivate *this,QAction *action)

{
  qsizetype qVar1;
  QMenuBarPrivate *in_RDI;
  long in_FS_OFFSET;
  int beforeIndex;
  QPlatformMenu *beforeMenu;
  QMenuBar *q;
  qsizetype in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  QMenuBarPrivate *in_stack_ffffffffffffff88;
  byte local_69;
  int local_5c;
  QPlatformMenu *pQVar2;
  QList<QAction_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  pQVar2 = (QPlatformMenu *)0x0;
  local_5c = indexOf(in_stack_ffffffffffffff88,(QAction *)0x0);
  while( true ) {
    local_5c = local_5c + 1;
    local_69 = 0;
    if (pQVar2 == (QPlatformMenu *)0x0) {
      in_stack_ffffffffffffff88 = (QMenuBarPrivate *)(long)local_5c;
      QWidget::actions((QWidget *)in_stack_ffffffffffffff88);
      qVar1 = QList<QAction_*>::size(&local_20);
      local_69 = (long)in_stack_ffffffffffffff88 < qVar1;
      QList<QAction_*>::~QList((QList<QAction_*> *)0x65df44);
    }
    if ((local_69 & 1) == 0) break;
    QWidget::actions((QWidget *)in_stack_ffffffffffffff88);
    QList<QAction_*>::at
              ((QList<QAction_*> *)CONCAT17(local_69,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    pQVar2 = getPlatformMenu(in_stack_ffffffffffffff88,
                             (QAction *)CONCAT17(local_69,in_stack_ffffffffffffff80));
    QList<QAction_*>::~QList((QList<QAction_*> *)0x65df88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformMenu *QMenuBarPrivate::findInsertionPlatformMenu(const QAction *action)
{
    Q_Q(QMenuBar);
    QPlatformMenu *beforeMenu = nullptr;
    for (int beforeIndex = indexOf(const_cast<QAction *>(action)) + 1;
         !beforeMenu && (beforeIndex < q->actions().size());
         ++beforeIndex) {
        beforeMenu = getPlatformMenu(q->actions().at(beforeIndex));
    }

    return beforeMenu;
}